

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smemory.c
# Opt level: O2

void * sexpand(int_t *prev_len,MemType type,int_t len_to_copy,int keep_prev,GlobalLU_t *Glu)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ExpHeader *pEVar3;
  char *src;
  int iVar4;
  long lVar5;
  int_t *piVar6;
  void *pvVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  float fVar14;
  float local_58;
  
  iVar4 = *prev_len;
  iVar12 = (int)((float)iVar4 * 1.5);
  if (Glu->num_expansions == 0) {
    iVar12 = iVar4;
  }
  if (keep_prev != 0) {
    iVar12 = iVar4;
  }
  pEVar3 = Glu->expanders;
  if (Glu->MemModel == SYSTEM) {
    pvVar7 = superlu_malloc((long)iVar12 << 2);
    if (Glu->num_expansions != 0) {
      if (keep_prev == 0) {
        local_58 = 1.5;
        iVar4 = 10;
        while (pvVar7 == (void *)0x0) {
          bVar13 = iVar4 == 0;
          iVar4 = iVar4 + -1;
          if (bVar13) {
            return (void *)0x0;
          }
          local_58 = (local_58 + 1.0) * 0.5;
          iVar12 = (int)((float)*prev_len * local_58);
          pvVar7 = superlu_malloc((long)iVar12 << 2);
        }
      }
      else if (pvVar7 == (void *)0x0) {
        return (void *)0x0;
      }
      if ((type & ~UCOL) == LSUB) {
        copy_mem_int(len_to_copy,pEVar3[type].mem,pvVar7);
      }
      else {
        copy_mem_float(len_to_copy,pEVar3[type].mem,pvVar7);
      }
      superlu_free(pEVar3[type].mem);
    }
    pEVar3[type].mem = pvVar7;
  }
  else if (Glu->num_expansions == 0) {
    pvVar7 = suser_malloc(iVar12 * 4,0,Glu);
    if ((type < LSUB) && (iVar4 = (int)pvVar7, ((ulong)pvVar7 & 7) != 0)) {
      uVar9 = (long)pvVar7 + 7;
      pvVar7 = (void *)(uVar9 & 0xfffffffffffffff8);
      iVar4 = ((uint)uVar9 & 0xfffffff8) - iVar4;
      uVar1 = (Glu->stack).used;
      uVar2 = (Glu->stack).top1;
      (Glu->stack).used = iVar4 + uVar1;
      (Glu->stack).top1 = iVar4 + uVar2;
    }
    pEVar3[type].mem = pvVar7;
  }
  else {
    iVar11 = (iVar12 - iVar4) * 4;
    iVar8 = (Glu->stack).used;
    if (keep_prev == 0) {
      fVar14 = 1.5;
      iVar10 = 10;
      while ((Glu->stack).size <= iVar8 + iVar11) {
        bVar13 = iVar10 == 0;
        iVar10 = iVar10 + -1;
        if (bVar13) {
          return (void *)0x0;
        }
        fVar14 = (fVar14 + 1.0) * 0.5;
        iVar12 = (int)(fVar14 * (float)iVar4);
        iVar11 = (iVar12 - iVar4) * 4;
      }
    }
    else if ((Glu->stack).size <= iVar8 + iVar11) {
      return (void *)0x0;
    }
    if (type != USUB) {
      src = (char *)pEVar3[type + UCOL].mem;
      lVar5 = (long)iVar11;
      user_bcopy(src,src + lVar5,(*(int *)&(Glu->stack).array + (Glu->stack).top1) - (int)src);
      if (type < USUB) {
        piVar6 = (int_t *)((long)pEVar3[3].mem + lVar5);
        pEVar3[3].mem = piVar6;
        Glu->usub = piVar6;
        if (type != LSUB) {
          piVar6 = (int_t *)((long)pEVar3[2].mem + lVar5);
          pEVar3[2].mem = piVar6;
          Glu->lsub = piVar6;
          if (type == LUSUP) {
            pvVar7 = (void *)(lVar5 + (long)pEVar3[1].mem);
            pEVar3[1].mem = pvVar7;
            Glu->ucol = pvVar7;
          }
        }
      }
      iVar4 = (Glu->stack).top1 + iVar11;
      (Glu->stack).top1 = iVar4;
      iVar8 = (Glu->stack).used + iVar11;
      (Glu->stack).used = iVar8;
      if (type == UCOL) {
        (Glu->stack).top1 = iVar4 + iVar11;
        (Glu->stack).used = iVar8 + iVar11;
      }
    }
  }
  pEVar3[type].size = iVar12;
  *prev_len = iVar12;
  if (Glu->num_expansions != 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
  }
  return pEVar3[type].mem;
}

Assistant:

void
*sexpand (
	 int_t *prev_len,   /* length used from previous call */
	 MemType type,    /* which part of the memory to expand */
	 int_t len_to_copy, /* size of the memory to be copied to new store */
	 int keep_prev,   /* = 1: use prev_len;
			     = 0: compute new_len to expand */
	 GlobalLU_t *Glu  /* modified - global LU data structures */
	)
{
    float    EXPAND = 1.5;
    float    alpha;
    void     *new_mem, *old_mem;
    int_t    new_len, bytes_to_copy;
    int      tries, lword, extra;
    ExpHeader *expanders = Glu->expanders; /* Array of 4 types of memory */

    alpha = EXPAND;

    if ( Glu->num_expansions == 0 || keep_prev ) {
        /* First time allocate requested */
        new_len = *prev_len;
    } else {
	new_len = alpha * *prev_len;
    }
    
    if ( type == LSUB || type == USUB ) lword = sizeof(int_t);
    else lword = sizeof(float);

    if ( Glu->MemModel == SYSTEM ) {
	new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
	if ( Glu->num_expansions != 0 ) {
	    tries = 0;
	    if ( keep_prev ) {
		if ( !new_mem ) return (NULL);
	    } else {
		while ( !new_mem ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    new_mem = (void *) SUPERLU_MALLOC((size_t)new_len * lword);
		}
	    }
	    if ( type == LSUB || type == USUB ) {
		copy_mem_int(len_to_copy, expanders[type].mem, new_mem);
	    } else {
		copy_mem_float(len_to_copy, expanders[type].mem, new_mem);
	    }
	    SUPERLU_FREE (expanders[type].mem);
	}
	expanders[type].mem = (void *) new_mem;
	
    } else { /* MemModel == USER */
    
	if ( Glu->num_expansions == 0 ) { /* First time initialization */
	
	    new_mem = suser_malloc(new_len * lword, HEAD, Glu);
	    if ( NotDoubleAlign(new_mem) &&
		(type == LUSUP || type == UCOL) ) {
		old_mem = new_mem;
		new_mem = (void *)DoubleAlign(new_mem);
		extra = (char*)new_mem - (char*)old_mem;
#if ( DEBUGlevel>=1 )
		printf("expand(): not aligned, extra %d\n", extra);
#endif		
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
	    }
	    
	    expanders[type].mem = (void *) new_mem;
	    
	} else { /* CASE: num_expansions != 0 */
	
	    tries = 0;
	    extra = (new_len - *prev_len) * lword;
	    if ( keep_prev ) {
		if ( StackFull(extra) ) return (NULL);
	    } else {
		while ( StackFull(extra) ) {
		    if ( ++tries > 10 ) return (NULL);
		    alpha = Reduce(alpha);
		    new_len = alpha * *prev_len;
		    extra = (new_len - *prev_len) * lword;	    
		}
	    }

	      /* Need to expand the memory: moving the content after the current MemType
	      	 to make extra room for the current MemType.
              	 Memory layout: [ LUSUP || UCOL || LSUB || USUB ]
	      */
  	    if ( type != USUB ) {
		new_mem = (void*)((char*)expanders[type + 1].mem + extra);
		bytes_to_copy = (char*)Glu->stack.array + Glu->stack.top1
		    - (char*)expanders[type + 1].mem;
		user_bcopy(expanders[type+1].mem, new_mem, bytes_to_copy);

		if ( type < USUB ) {
		    Glu->usub = expanders[USUB].mem =
			(void*)((char*)expanders[USUB].mem + extra);
		}
		if ( type < LSUB ) {
		    Glu->lsub = expanders[LSUB].mem =
			(void*)((char*)expanders[LSUB].mem + extra);
		}
		if ( type < UCOL ) {
		    Glu->ucol = expanders[UCOL].mem =
			(void*)((char*)expanders[UCOL].mem + extra);
		}
		Glu->stack.top1 += extra;
		Glu->stack.used += extra;
		if ( type == UCOL ) {
		    Glu->stack.top1 += extra;   /* Add same amount for USUB */
		    Glu->stack.used += extra;
		}
		
	    } /* end expansion */

	} /* else ... */
    }

    expanders[type].size = new_len;
    *prev_len = new_len;
    if ( Glu->num_expansions ) ++Glu->num_expansions;
    
    return (void *) expanders[type].mem;
    
}